

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-features.h
# Opt level: O1

void __thiscall wasm::Memory64Lowering::run(Memory64Lowering *this,Module *module)

{
  byte *pbVar1;
  pointer puVar2;
  Memory *pMVar3;
  pointer puVar4;
  Table *pTVar5;
  unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *memory;
  pointer puVar6;
  pointer puVar7;
  
  if (((module->features).features & 0x800) != 0) {
    WalkerPass<wasm::PostWalker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>_>
    ::run(&this->
           super_WalkerPass<wasm::PostWalker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>_>
          ,module);
    puVar2 = (module->memories).
             super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar6 = (module->memories).
                  super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar6 != puVar2; puVar6 = puVar6 + 1)
    {
      pMVar3 = (puVar6->_M_t).
               super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
               super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
      if (((pMVar3->addressType).id == 3) &&
         ((pMVar3->addressType).id = 2, (pMVar3->max).addr - 0x10001 < 0xfffffffffffefffe)) {
        (pMVar3->max).addr = 0x10000;
      }
    }
    puVar4 = (module->tables).
             super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar7 = (module->tables).
                  super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar7 != puVar4; puVar7 = puVar7 + 1)
    {
      pTVar5 = (puVar7->_M_t).super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
               _M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
               super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl;
      if ((pTVar5->addressType).id == 3) {
        (pTVar5->addressType).id = 2;
      }
    }
    pbVar1 = (byte *)((long)&(module->features).features + 1);
    *pbVar1 = *pbVar1 & 0xf7;
  }
  return;
}

Assistant:

bool has(FeatureSet f) const { return (features & f) == f.features; }